

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.c
# Opt level: O2

_Bool IsCardMovableToDesk(Card_t card,SolStack_t *stackPtr)

{
  _Bool _Var1;
  Card_t *pCVar2;
  
  if (stackPtr != (SolStack_t *)0x0) {
    pCVar2 = stk_CTopCard(stackPtr);
    if (pCVar2 == (Card_t *)0x0) {
      return card.m_type == CT_KING;
    }
    _Var1 = card_IsOneLess(card,*pCVar2);
    if (_Var1) {
      _Var1 = card_IsOppositeColor(card,*pCVar2);
      return _Var1;
    }
  }
  return false;
}

Assistant:

static bool IsCardMovableToDesk(Card_t card, const SolStack_t* stackPtr)
{
  if (stackPtr) {
    const Card_t* topCardPtr = stk_CTopCard(stackPtr);
    if (topCardPtr) {
      return (card_IsOneLess(card, *topCardPtr) &&
              card_IsOppositeColor(card, *topCardPtr));
    } else {
      return (card.m_type == CT_KING);
    }
  }
  return false;
}